

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

void __thiscall pg::DTLSolver::search_rec(DTLSolver *this,bitset *R,int player,int depth)

{
  int iVar1;
  uint uVar2;
  Game *pGVar3;
  uint *puVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int v;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  _label_vertex local_e0;
  ulong local_d0;
  bitset Z;
  bitset V;
  bitset X;
  bitset Z2;
  
  bitset::bitset(&X,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&V,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&Z,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&Z2,((this->super_Solver).game)->n_vertices);
  if (1 < (this->super_Solver).trace) {
    std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent region:\x1b[m");
    sVar9 = bitset::find_first(R);
    for (; poVar10 = (this->super_Solver).logger, sVar9 != 0xffffffffffffffff;
        sVar9 = bitset::find_next(R,sVar9)) {
      poVar10 = std::operator<<(poVar10," \x1b[1;38;5;15m");
      local_e0.g = (this->super_Solver).game;
      local_e0.v = (int)sVar9;
      poVar10 = operator<<(poVar10,&local_e0);
      std::operator<<(poVar10,"\x1b[m");
    }
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  do {
    while( true ) {
      while( true ) {
        for (lVar13 = 0; V._bitssize << 3 != lVar13; lVar13 = lVar13 + 8) {
          *(undefined8 *)((long)V._bits + lVar13) = 0;
        }
        iVar7 = best_vertices(this,&V,R,player);
        if (iVar7 == 0) {
          bitset::~bitset(&Z2);
          bitset::~bitset(&Z);
          bitset::~bitset(&V);
          bitset::~bitset(&X);
          return;
        }
        if (0 < (this->super_Solver).trace) {
          std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mbest vertices:\x1b[m");
          for (sVar9 = bitset::find_first(&V); sVar9 != 0xffffffffffffffff;
              sVar9 = bitset::find_next(&V,sVar9)) {
            poVar10 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
            local_e0.g = (this->super_Solver).game;
            local_e0.v = (int)sVar9;
            poVar10 = operator<<(poVar10,&local_e0);
            std::operator<<(poVar10,"\x1b[m");
          }
          if (iVar7 == 1) {
            std::operator<<((this->super_Solver).logger," (stable)");
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        if (iVar7 != 1) break;
        do {
          bitset::operator=(&Z,R);
          this->cur_depth = depth;
          bVar6 = sptl(this,&V,&this->W,&Z,player);
        } while (bVar6);
        for (lVar13 = 0; Z._bitssize << 3 != lVar13; lVar13 = lVar13 + 8) {
          *(undefined8 *)((long)Z._bits + lVar13) = 0;
        }
        uVar14 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
        while( true ) {
          uVar14 = uVar14 - 1;
          uVar12 = (uint)uVar14;
          if ((int)uVar12 < 0) break;
          uVar17 = uVar12 & 0x7fffffff;
          uVar15 = uVar17 >> 6;
          if ((V._bits[uVar15] >> (uVar14 & 0x3f) & 1) != 0) {
            uVar11 = 1L << (uVar14 & 0x3f);
            if ((X._bits[uVar15] & uVar11) == 0) {
              X._bits[uVar15] = X._bits[uVar15] | uVar11;
              this->str[uVar17] = -1;
              iVar7 = (this->Q).pointer;
              (this->Q).pointer = iVar7 + 1;
              (this->Q).queue[iVar7] = uVar12;
              local_d0 = uVar14;
              while( true ) {
                iVar7 = (this->Q).pointer;
                uVar14 = local_d0;
                if ((long)iVar7 == 0) break;
                (this->Q).pointer = iVar7 + -1;
                uVar2 = (this->Q).queue[(long)iVar7 + -1];
                bVar5 = (byte)uVar2 & 0x3f;
                R->_bits[(ulong)(long)(int)uVar2 >> 6] =
                     R->_bits[(ulong)(long)(int)uVar2 >> 6] &
                     (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                attractVertices(this,player,uVar2,R,&X,R,
                                ((this->super_Solver).game)->_priority[uVar17]);
                attractTangles(this,player,uVar2,R,&X,R,
                               ((this->super_Solver).game)->_priority[uVar17]);
              }
            }
          }
        }
      }
      uVar14 = 0;
      iVar7 = 0;
      while( true ) {
        pGVar3 = (this->super_Solver).game;
        uVar11 = pGVar3->n_vertices;
        if ((long)uVar11 <= (long)uVar14) break;
        if ((R->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
          iVar1 = pGVar3->_priority[uVar14];
          iVar16 = iVar7;
          if ((iVar7 < iVar1) && (iVar8 = (this->Q).pointer, iVar16 = iVar1, iVar8 != 0))
          goto LAB_0016cd5c;
          bVar6 = attracts(this,player,(uint)uVar14,&X,R);
          iVar7 = iVar16;
          if (bVar6) {
            Z._bits[uVar14 >> 6] = Z._bits[uVar14 >> 6] | 1L << (uVar14 & 0x3f);
            this->str[uVar14] = -1;
            iVar8 = (this->Q).pointer;
            (this->Q).pointer = iVar8 + 1;
            (this->Q).queue[iVar8] = (uint)uVar14;
          }
        }
        uVar14 = uVar14 + 1;
      }
      iVar8 = (this->Q).pointer;
      if (iVar8 != 0) break;
      if (1 < (this->super_Solver).trace) {
        poVar10 = std::operator<<((this->super_Solver).logger,anon_var_dwarf_24b243);
        std::endl<char,std::char_traits<char>>(poVar10);
        uVar11 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
      }
      uVar14 = uVar11 & 0xffffffff;
      while( true ) {
        uVar14 = uVar14 - 1;
        uVar12 = (uint)uVar14;
        if ((int)uVar12 < 0) break;
        uVar17 = uVar12 & 0x7fffffff;
        uVar15 = uVar17 >> 6;
        if ((V._bits[uVar15] >> (uVar14 & 0x3f) & 1) != 0) {
          uVar11 = 1L << (uVar14 & 0x3f);
          if ((X._bits[uVar15] & uVar11) == 0) {
            X._bits[uVar15] = X._bits[uVar15] | uVar11;
            this->str[uVar17] = -1;
            iVar7 = (this->Q).pointer;
            (this->Q).pointer = iVar7 + 1;
            (this->Q).queue[iVar7] = uVar12;
            local_d0 = uVar14;
            while( true ) {
              iVar7 = (this->Q).pointer;
              if ((long)iVar7 == 0) break;
              (this->Q).pointer = iVar7 + -1;
              uVar2 = (this->Q).queue[(long)iVar7 + -1];
              bVar5 = (byte)uVar2 & 0x3f;
              R->_bits[(ulong)(long)(int)uVar2 >> 6] =
                   R->_bits[(ulong)(long)(int)uVar2 >> 6] &
                   (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
              if (2 < (this->super_Solver).trace) {
                iVar7 = (this->Zvec).pointer;
                (this->Zvec).pointer = iVar7 + 1;
                (this->Zvec).queue[iVar7] = uVar2;
              }
              attractVertices(this,player,uVar2,R,&X,R,
                              ((this->super_Solver).game)->_priority[uVar17]);
              attractTangles(this,player,uVar2,R,&X,R,((this->super_Solver).game)->_priority[uVar17]
                            );
            }
            uVar14 = local_d0;
            if (1 < (this->super_Solver).trace) {
              std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ");
              poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;36m");
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,((this->super_Solver).game)->_priority[uVar17]);
              std::operator<<(poVar10,"\x1b[m");
              for (uVar14 = 0; uVar14 < (uint)(this->Zvec).pointer; uVar14 = uVar14 + 1) {
                uVar2 = (this->Zvec).queue[uVar14];
                poVar10 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
                local_e0.g = (this->super_Solver).game;
                local_e0.v = uVar2;
                poVar10 = operator<<(poVar10,&local_e0);
                std::operator<<(poVar10,"\x1b[m");
                if (this->str[(int)uVar2] != -1) {
                  poVar10 = std::operator<<((this->super_Solver).logger,"->");
                  local_e0.g = (this->super_Solver).game;
                  local_e0.v = this->str[(int)uVar2];
                  operator<<(poVar10,&local_e0);
                }
              }
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
              (this->Zvec).pointer = 0;
              uVar14 = local_d0;
            }
          }
        }
      }
    }
LAB_0016cd5c:
    while (iVar8 != 0) {
      (this->Q).pointer = iVar8 + -1;
      uVar2 = (this->Q).queue[(long)iVar8 + -1];
      bVar5 = (byte)uVar2 & 0x3f;
      R->_bits[(ulong)(long)(int)uVar2 >> 6] =
           R->_bits[(ulong)(long)(int)uVar2 >> 6] &
           (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      attractVertices(this,player,uVar2,R,&Z,R,iVar7);
      attractTangles(this,player,uVar2,R,&Z,R,iVar7);
      iVar8 = (this->Q).pointer;
    }
    if (1 < (this->super_Solver).trace) {
      poVar10 = std::operator<<((this->super_Solver).logger,anon_var_dwarf_24b22b);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
      std::operator<<(poVar10,":\x1b[m");
      for (sVar9 = bitset::find_first(&Z); poVar10 = (this->super_Solver).logger,
          sVar9 != 0xffffffffffffffff; sVar9 = bitset::find_next(&Z,sVar9)) {
        poVar10 = std::operator<<(poVar10," \x1b[1;38;5;15m");
        local_e0.g = (this->super_Solver).game;
        local_e0.v = (int)sVar9;
        poVar10 = operator<<(poVar10,&local_e0);
        std::operator<<(poVar10,"\x1b[m");
      }
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    pGVar3 = (this->super_Solver).game;
    puVar4 = (this->Q).queue;
    uVar14 = (ulong)(uint)pGVar3->n_vertices;
    while( true ) {
      uVar14 = uVar14 - 1;
      uVar12 = (uint)uVar14;
      if ((int)uVar12 < 0) break;
      iVar8 = pGVar3->_priority[uVar12 & 0x7fffffff];
      if (iVar8 < iVar7) break;
      uVar15 = (uVar12 & 0x7fffffff) >> 6;
      if (((Z._bits[uVar15] >> (uVar14 & 0x3f) & 1) != 0) && (iVar8 == iVar7)) {
        X._bits[uVar15] = X._bits[uVar15] | 1L << (uVar14 & 0x3f);
        iVar8 = (this->Q).pointer;
        (this->Q).pointer = iVar8 + 1;
        puVar4[iVar8] = uVar12;
      }
    }
    while( true ) {
      iVar8 = (this->Q).pointer;
      if ((long)iVar8 == 0) break;
      (this->Q).pointer = iVar8 + -1;
      uVar2 = (this->Q).queue[(long)iVar8 + -1];
      bVar5 = (byte)uVar2 & 0x3f;
      Z._bits[(ulong)(long)(int)uVar2 >> 6] =
           Z._bits[(ulong)(long)(int)uVar2 >> 6] &
           (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      attractVertices(this,1 - player,uVar2,&Z,&X,&Z,iVar7);
    }
    bitset::operator|=(&X,&Z);
    search_rec(this,&Z,player,depth + 1);
    for (lVar13 = 0; Z._bitssize << 3 != lVar13; lVar13 = lVar13 + 8) {
      *(undefined8 *)((long)Z._bits + lVar13) = 0;
    }
  } while( true );
}

Assistant:

void
DTLSolver::search_rec(bitset &R, const int player, const int depth)
{
    bitset X(nodecount()); // vertices removed from R
    bitset V(nodecount()); // the best vertices each iteration
    bitset Z(nodecount()); // holds various subregions
    bitset Z2(nodecount()); // holds various subregions

    if (trace >= 2) {
        logger << "\033[1;38;5;202mcurrent region:\033[m";
        for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
        }
        logger << std::endl;
    }

    while (true) {
        // Compute the best vertices V
        V.reset();
        int result = best_vertices(V, R, player);
        if (result == 0) return; // done

        if (trace >= 1) {
            logger << "\033[1;38;5;202mbest vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            if (result == 1) logger << " (stable)";
            logger << std::endl;
        }

        // If the best vertices are stable, run SPTL to learn local dominions and add them to X

        if (result == 1) {
            // Run SPTL for a while
            bool more = true;
            while (more) {
                Z = R;
                cur_depth = depth;
                more = sptl(V, W, Z, player);
            }
            Z.reset();

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
                }
            }

            continue;
        }

        // If the best vertices are not stable, first try to attract to X.
        // Find the lowest threshold to attract to X.

        int t = 0; // initial threshold
        for (int v=0; v<nodecount(); v++) {
            if (R[v]) {
                if (priority(v) > t) {
                    if (Q.nonempty()) break;
                    // update threshold
                    t = priority(v);
                }
                if (attracts(player, v, X, R)) {
                    Z[v] = true;
                    str[v] = -1;
                    Q.push(v);
                }
            }
        }

        if (Q.nonempty()) {
            // Apparently, we found the lowest threshold t, they are in Z
            // Now attract with threshold t from R to Z

            while (Q.nonempty()) {
                const int u = Q.pop();
                R[u] = false;
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "X ∪= attracted with threshold " << t << ":\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                }
                logger << std::endl;
            }
#endif

            // Now remove the attractor to threshold vertices from Z (by moving them to X)
            for (int u=nodecount()-1; u >= 0; u--) {
                if (priority(u) < t) break; // done
                if (Z[u] and priority(u) == t) {
                    X[u] = true;
                    Q.push(u);
                }
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                Z[u] = false;
                attractVertices(1-player, u, Z, X, Z, t);
            }

            // And add all vertices in Z also to X
            X |= Z;

            // Recursively Z
            /*if (depth == 0)*/ search_rec(Z, player, depth+1);
            Z.reset();
        } else {
#ifndef NDEBUG
            if (trace >= 2) logger << "X ∪= Dom(V)" << std::endl;
#endif

            // Add Dom(V,R) to X
            for (int top=nodecount()-1; top>=0; top--) {
                if (V[top] and !X[top]) {
                    X[top] = true; // add to <X>
                    str[top] = -1;
                    Q.push(top);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        R[v] = false;
#ifndef NDEBUG
                        if (trace >= 3) Zvec.push(v);
#endif
                        attractVertices(player, v, R, X, R, priority(top));
                        attractTangles(player, v, R, X, R, priority(top));
                    }
#ifndef NDEBUG
                    if (trace >= 2) {
                        // report region
                        logger << "\033[1;33mregion\033[m ";
                        logger << "\033[1;36m" << priority(top) << "\033[m";
                        for (unsigned int i=0; i<Zvec.size(); i++) {
                            int v = Zvec[i];
                            logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                            if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                        }
                        logger << std::endl;
                        Zvec.clear();
                    }
#endif
                }
            }
        }
    }
}